

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackstring.hpp
# Opt level: O0

void __thiscall StackString<32UL,_char16_t>::Resize(StackString<32UL,_char16_t> *this,SIZE_T count)

{
  SIZE_T count_local;
  StackString<32UL,_char16_t> *this_local;
  
  if (this->m_buffer == (char16_t *)0x0) {
    if (count < 0x21) {
      this->m_size = 0x21;
      this->m_buffer = this->m_innerBuffer;
      this->m_count = count;
    }
    else {
      ReallocateBuffer(this,count);
    }
  }
  else if (this == (StackString<32UL,_char16_t> *)this->m_buffer) {
    if (count < 0x21) {
      this->m_count = count;
      this->m_size = 0x21;
    }
    else {
      ReallocateBuffer(this,count);
    }
  }
  else {
    ReallocateBuffer(this,count);
  }
  return;
}

Assistant:

void Resize(SIZE_T count)
    {
        if (NULL == m_buffer)
        {
            if (count > STACKCOUNT)
            {
                ReallocateBuffer(count);
            }
            else
            {
                m_size = STACKCOUNT+1;
                m_buffer = m_innerBuffer;
                m_count = count;
            }
        }
        else if (m_innerBuffer == m_buffer)
        {
            if (count > STACKCOUNT)
            {
                ReallocateBuffer(count);
            }
            else
            {
                m_count = count;
                m_size = STACKCOUNT+1;
            }
        }
        else
        {
            ReallocateBuffer(count);
        }

        return;
    }